

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O2

int Curl_dyn_vprintf(dynbuf *dyn,char *format,__va_list_tag *ap_save)

{
  bool bVar1;
  asprintf info;
  
  info.fail = false;
  info.b = dyn;
  dprintf_formatf(&info,alloc_addbyter,format,ap_save);
  bVar1 = info.fail == true;
  if (bVar1) {
    Curl_dyn_free(info.b);
  }
  return (uint)bVar1;
}

Assistant:

int Curl_dyn_vprintf(struct dynbuf *dyn, const char *format, va_list ap_save)
{
  struct asprintf info;
  info.b = dyn;
  info.fail = 0;

  (void)dprintf_formatf(&info, alloc_addbyter, format, ap_save);
  if(info.fail) {
    Curl_dyn_free(info.b);
    return 1;
  }
  return 0;
}